

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char *__src;
  archive_string *paVar1;
  size_t sVar2;
  size_t w;
  char *ss;
  wchar_t local_50;
  uint32_t uc;
  wchar_t ret;
  wchar_t n;
  char *endp;
  char *p;
  char *s;
  archive_string_conv *sc_local;
  size_t len_local;
  void *_p_local;
  archive_string *as_local;
  
  local_50 = L'\0';
  s = (char *)sc;
  sc_local = (archive_string_conv *)len;
  len_local = (size_t)_p;
  _p_local = as;
  paVar1 = archive_string_ensure(as,as->length + len + 1);
  if (paVar1 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    p = (char *)len_local;
    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
    _ret = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - 1);
    __src = (char *)len_local;
    do {
      while (uc = utf8_to_unicode((uint32_t *)((long)&ss + 4),p,(size_t)sc_local), L'\0' < (int)uc)
      {
        p = p + (int)uc;
        sc_local = (archive_string_conv *)((long)sc_local - (long)(int)uc);
      }
      if (__src < p) {
        if (_ret < endp + ((long)p - (long)__src)) {
          *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
          paVar1 = archive_string_ensure
                             ((archive_string *)_p_local,
                              (long)sc_local->converter + *(long *)((long)_p_local + 0x10) + -0x3f);
          if (paVar1 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
          _ret = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - 1);
        }
        memcpy(endp,__src,(long)p - (long)__src);
        endp = endp + ((long)p - (long)__src);
      }
      if ((int)uc < 0) {
        if (((uc == 0xfffffffd) && (0xd7ff < ss._4_4_)) && (ss._4_4_ < 0xe000)) {
          uc = cesu8_to_unicode((uint32_t *)((long)&ss + 4),p,(size_t)sc_local);
        }
        if ((int)uc < 0) {
          local_50 = L'\xffffffff';
          uc = -uc;
        }
        while (sVar2 = unicode_to_utf8(endp,(long)_ret - (long)endp,ss._4_4_), sVar2 == 0) {
          *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
          paVar1 = archive_string_ensure
                             ((archive_string *)_p_local,
                              (long)sc_local->converter + *(long *)((long)_p_local + 0x10) + -0x3f);
          if (paVar1 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
          _ret = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - 1);
        }
        endp = endp + sVar2;
        p = p + (int)uc;
        sc_local = (archive_string_conv *)((long)sc_local - (long)(int)uc);
      }
      __src = p;
    } while (0 < (int)uc);
    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
    *(undefined1 *)(*_p_local + *(long *)((long)_p_local + 8)) = 0;
    as_local._4_4_ = local_50;
  }
  return as_local._4_4_;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	int n, ret = 0;

	(void)sc; /* UNUSED */

	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length -1;
	do {
		uint32_t uc;
		const char *ss = s;
		size_t w;

		/*
		 * Forward byte sequence until a conversion of that is needed.
		 */
		while ((n = utf8_to_unicode(&uc, s, len)) > 0) {
			s += n;
			len -= n;
		}
		if (ss < s) {
			if (p + (s - ss) > endp) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}

			memcpy(p, ss, s - ss);
			p += s - ss;
		}

		/*
		 * If n is negative, current byte sequence needs a replacement.
		 */
		if (n < 0) {
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				/* Current byte sequence may be CESU-8. */
				n = cesu8_to_unicode(&uc, s, len);
			}
			if (n < 0) {
				ret = -1;
				n *= -1;/* Use a replaced unicode character. */
			}

			/* Rebuild UTF-8 byte sequence. */
			while ((w = unicode_to_utf8(p, endp - p, uc)) == 0) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}
			p += w;
			s += n;
			len -= n;
		}
	} while (n > 0);
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret);
}